

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

void __thiscall
wasm::Pusher::Pusher
          (Pusher *this,Block *block,LocalAnalyzer *analyzer,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *numGetsSoFar,PassOptions *passOptions
          ,Module *module)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  LocalSet *pLVar4;
  Index local_44;
  uint local_40;
  Index firstPushable;
  Index i;
  Index nothing;
  Module *module_local;
  PassOptions *passOptions_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *numGetsSoFar_local;
  LocalAnalyzer *analyzer_local;
  Block *block_local;
  Pusher *this_local;
  
  this->list = &block->list;
  this->analyzer = analyzer;
  this->numGetsSoFar = numGetsSoFar;
  this->passOptions = passOptions;
  this->module = module;
  std::
  unordered_map<wasm::LocalSet_*,_wasm::EffectAnalyzer,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>_>
  ::unordered_map(&this->pushableEffects);
  local_40 = 0;
  local_44 = 0xffffffff;
LAB_01b34318:
  do {
    while( true ) {
      sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&this->list->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      if (sVar2 <= local_40) {
        return;
      }
      if (local_44 != 0xffffffff) break;
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)local_40);
      pLVar4 = isPushable(this,*ppEVar3);
      if (pLVar4 == (LocalSet *)0x0) break;
      local_44 = local_40;
      local_40 = local_40 + 1;
    }
    if (local_44 != 0xffffffff) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)local_40);
      bVar1 = isPushPoint(this,*ppEVar3);
      if (bVar1) {
        optimizeIntoIf(this,local_44,local_40);
        sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
        if ((ulong)local_40 < sVar2 - 1) {
          local_40 = optimizeSegment(this,local_44,local_40);
        }
        local_44 = 0xffffffff;
        goto LAB_01b34318;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

Pusher(Block* block,
         LocalAnalyzer& analyzer,
         std::vector<Index>& numGetsSoFar,
         PassOptions& passOptions,
         Module& module)
    : list(block->list), analyzer(analyzer), numGetsSoFar(numGetsSoFar),
      passOptions(passOptions), module(module) {
    // Find an optimization segment: from the first pushable thing, to the first
    // point past which we want to push. We then push in that range before
    // continuing forward.
    const Index nothing = -1;
    Index i = 0;
    Index firstPushable = nothing;
    while (i < list.size()) {
      if (firstPushable == nothing && isPushable(list[i])) {
        firstPushable = i;
        i++;
        continue;
      }
      if (firstPushable != nothing && isPushPoint(list[i])) {
        // Optimize this segment, and proceed from where it tells us. First
        // optimize things into the if, if possible, which does not move the
        // push point. Then move things past the push point (which has the
        // relative effect of moving the push point backwards as other things
        // move forward).
        optimizeIntoIf(firstPushable, i);
        // We never need to push past a final element, as we couldn't be used
        // after it.
        if (i < list.size() - 1) {
          i = optimizeSegment(firstPushable, i);
        }
        firstPushable = nothing;
        continue;
      }
      i++;
    }
  }